

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O1

void fft2dFree(void)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0x3f;
  do {
    if (Array2d[lVar1] != (float *)0x0) {
      free(Array2d[lVar1]);
      Array2d[lVar1] = (float *)0x0;
    }
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  fftFree();
  return;
}

Assistant:

void fft2dFree(){
// free storage for columns of 2d ffts and call fftFree to free all BRLow and Utbl storage
long i1;
for (i1=8*sizeof(long)-1; i1>=0; i1--){
	if (Array2d[i1] != 0){
		free(Array2d[i1]);
		Array2d[i1] = 0;
	};
};
fftFree();
}